

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_dalloc_bin_locked_impl
               (tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,extent_t *slab,void *ptr,
               _Bool junked)

{
  byte bVar1;
  uint uVar2;
  arena_t *arena_00;
  uint in_ECX;
  long in_RDX;
  extent_t *in_R8;
  extent_t *in_R9;
  byte in_stack_00000008;
  uint nfree;
  bin_info_t *bin_info;
  arena_slab_data_t *slab_data;
  bin_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  arena_t *arena_01;
  undefined7 in_stack_ffffffffffffffc8;
  
  bVar1 = in_stack_00000008 & 1;
  arena_00 = (arena_t *)extent_slab_data_get(in_R8);
  arena_01 = (arena_t *)(bin_infos + in_ECX);
  if (((bVar1 & 1) == 0) && ((opt_junk_free & 1U) != 0)) {
    arena_dalloc_junk_small_impl
              ((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (bin_info_t *)in_stack_ffffffffffffffa8);
  }
  arena_slab_reg_dalloc
            (in_R9,(arena_slab_data_t *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),arena_00);
  uVar2 = extent_nfree_get(in_R8);
  if (uVar2 == *(uint *)&arena_01->last_thd) {
    arena_dissociate_bin_slab
              (arena_00,(extent_t *)arena_01,(bin_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
    arena_dalloc_bin_slab
              ((tsdn_t *)arena_00,arena_01,(extent_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  else if ((uVar2 == 1) && (in_R8 != *(extent_t **)(in_RDX + 0x70))) {
    arena_bin_slabs_full_remove
              ((arena_t *)CONCAT44(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
               (extent_t *)0x11686d);
    arena_bin_lower_slab
              ((tsdn_t *)arena_00,arena_01,(extent_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  *(long *)(in_RDX + 0x90) = *(long *)(in_RDX + 0x90) + 1;
  *(long *)(in_RDX + 0xa0) = *(long *)(in_RDX + 0xa0) + -1;
  return;
}

Assistant:

static void
arena_dalloc_bin_locked_impl(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, extent_t *slab, void *ptr, bool junked) {
	arena_slab_data_t *slab_data = extent_slab_data_get(slab);
	const bin_info_t *bin_info = &bin_infos[binind];

	if (!junked && config_fill && unlikely(opt_junk_free)) {
		arena_dalloc_junk_small(ptr, bin_info);
	}

	arena_slab_reg_dalloc(slab, slab_data, ptr);
	unsigned nfree = extent_nfree_get(slab);
	if (nfree == bin_info->nregs) {
		arena_dissociate_bin_slab(arena, slab, bin);
		arena_dalloc_bin_slab(tsdn, arena, slab, bin);
	} else if (nfree == 1 && slab != bin->slabcur) {
		arena_bin_slabs_full_remove(arena, bin, slab);
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}

	if (config_stats) {
		bin->stats.ndalloc++;
		bin->stats.curregs--;
	}
}